

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

Alignment __thiscall QCss::Declaration::alignmentValue(Declaration *this)

{
  DeclarationData *pDVar1;
  long lVar2;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar3;
  QFlagsStorage<Qt::AlignmentFlag> QVar4;
  long in_FS_OFFSET;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->d).d.ptr;
  if (*(ulong *)&(pDVar1->parsed).d.field_0x18 < 4) {
    lVar2 = (pDVar1->values).d.size;
    if (lVar2 - 3U < 0xfffffffffffffffe) {
      QVar4.i = 0x21;
    }
    else {
      QVar4.i = (Int)parseAlignment((pDVar1->values).d.ptr,(int)lVar2);
      ::QVariant::QVariant(&local_40,QVar4.i);
      ::QVariant::operator=(&((this->d).d.ptr)->parsed,&local_40);
      ::QVariant::~QVariant(&local_40);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)QVar4.i;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)::QVariant::toInt((bool *)&pDVar1->parsed);
    return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
           (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i
    ;
  }
  __stack_chk_fail();
}

Assistant:

Qt::Alignment Declaration::alignmentValue() const
{
    if (d->parsed.isValid())
        return Qt::Alignment(d->parsed.toInt());
    if (d->values.isEmpty() || d->values.size() > 2)
        return Qt::AlignLeft | Qt::AlignTop;

    Qt::Alignment v = parseAlignment(d->values.constData(), d->values.size());
    d->parsed = int(v);
    return v;
}